

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_cpsr_write_eret_arm(CPUARMState *env,uint32_t val)

{
  uint64_t *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint32_t mask;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  CPUARMState *__mptr;
  
  puVar1 = env[-10].cp15.c14_pmevcntr + 0x1b;
  puVar4 = *(undefined8 **)&env[1].NF;
  while (puVar4 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)puVar4[2];
    (*(code *)*puVar4)(puVar1,puVar4[1]);
    puVar4 = puVar2;
  }
  uVar3 = env->features;
  uVar6 = 0xf01f03df;
  if ((uVar3 & 8) == 0) {
    uVar6 = 0xf01001df;
  }
  uVar6 = uVar6 | ((uint)uVar3 & 0x8000) << 0xc | (uint)((uVar3 & 0xffff) >> 9);
  uVar5 = uVar6 + 0x600fc00;
  if ((uVar3 & 0x40) == 0) {
    uVar5 = uVar6;
  }
  uVar6 = uVar5 + 0x1000000;
  if (*(uint *)((long)env[1].xregs + 0x3c) < 0x10000000) {
    uVar6 = uVar5;
  }
  mask = uVar6 | 0x400000;
  if ((env[1].xregs[0xc] & 0xf0000) == 0) {
    mask = uVar6;
  }
  cpsr_write_arm(env,val,mask,CPSRWriteExceptionReturn);
  env->regs[0xf] = env->regs[0xf] & ((uint)(env->thumb != 0) * 2 | 0xfffffffc);
  arm_rebuild_hflags_arm(env);
  puVar4 = *(undefined8 **)&env[1].QF;
  while (puVar4 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)puVar4[2];
    (*(code *)*puVar4)(puVar1,puVar4[1]);
    puVar4 = puVar2;
  }
  return;
}

Assistant:

void HELPER(cpsr_write_eret)(CPUARMState *env, uint32_t val)
{
    uint32_t mask;

    arm_call_pre_el_change_hook(env_archcpu(env));

    mask = aarch32_cpsr_valid_mask(env->features, &env_archcpu(env)->isar);
    cpsr_write(env, val, mask, CPSRWriteExceptionReturn);

    /* Generated code has already stored the new PC value, but
     * without masking out its low bits, because which bits need
     * masking depends on whether we're returning to Thumb or ARM
     * state. Do the masking now.
     */
    env->regs[15] &= (env->thumb ? ~1 : ~3);
    arm_rebuild_hflags(env);

    arm_call_el_change_hook(env_archcpu(env));
}